

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  pointer pcVar1;
  pointer pcVar2;
  cmState *pcVar3;
  char *pcVar4;
  pointer pSVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  string *path;
  SaveCacheEntry *i;
  pointer pbVar10;
  pointer key;
  SaveCacheEntry save;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  ostringstream warning;
  undefined1 local_270 [32];
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  char *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  CacheEntryType local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_1a8 + 0x10;
  pcVar2 = (var->_M_dataplus)._M_p;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + var->_M_string_length);
  cmSystemTools::ExpandListArgument((string *)local_1a8,&local_208,true);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  cmState::SetGlobalProperty(pcVar3,(string *)local_1a8,"");
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar6 = cmState::GetIsInTryCompile
                    ((this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  iVar7 = 0;
  if (!bVar6) {
    local_1e8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "You have changed variables that require your cache to be deleted.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Configure will be re-run and you may have to reset some variables.\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The following variables have changed:\n",0x26);
    if (local_208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar10 = local_208.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_250._M_p = (pointer)&local_240;
        local_270._8_8_ = 0;
        local_270[0x10] = '\0';
        local_248 = 0;
        local_240._M_local_buf[0] = '\0';
        local_230._M_p = (pointer)&local_220;
        local_228 = (char *)0x0;
        local_220._M_local_buf[0] = '\0';
        local_270._0_8_ = local_270 + 0x10;
        std::__cxx11::string::_M_assign((string *)local_270);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,
                            pbVar10->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"= ",2);
        std::__cxx11::string::_M_assign((string *)&local_250);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar10[1]._M_dataplus._M_p,
                            pbVar10[1]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        pcVar9 = cmState::GetCacheEntryValue
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_270
                           );
        if (pcVar9 != (char *)0x0) {
          local_210 = cmState::GetCacheEntryType
                                ((this->State)._M_t.
                                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                                 (string *)local_270);
          pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"HELPSTRING","");
          pcVar9 = cmState::GetCacheEntryProperty(pcVar3,(string *)local_270,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = local_228;
          if (pcVar9 != (char *)0x0) {
            strlen(pcVar9);
            std::__cxx11::string::_M_replace((ulong)&local_230,0,pcVar4,(ulong)pcVar9);
          }
        }
        std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::emplace_back<SaveCacheEntry>
                  (&local_1e8,(SaveCacheEntry *)local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_p != &local_220) {
          operator_delete(local_230._M_p,
                          CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p,
                          CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
        }
        pbVar10 = pbVar10 + 2;
      } while (pbVar10 !=
               local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    path = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmState::DeleteCache
              ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,path);
    LoadCache(this);
    pSVar5 = local_1e8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (key = local_1e8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl
               .super__Vector_impl_data._M_start; key != pSVar5; key = key + 1) {
      AddCacheEntry(this,&key->key,(key->value)._M_dataplus._M_p,(key->help)._M_dataplus._M_p,
                    key->type);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_270,(char *)0x0);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_270._17_7_,local_270[0x10]) + 1);
    }
    iVar7 = 0;
    if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)) {
      bVar6 = cmSystemTools::GetInterruptFlag();
      iVar7 = 0;
      if (!bVar6) {
        iVar7 = Configure(this);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&local_1e8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return iVar7;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->State->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (std::vector<std::string>::iterator i = argsSplit.begin();
       i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (const char* help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = help;
      }
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value.c_str(), i.help.c_str(), i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccuredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}